

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomized_attacker_strategy.cpp
# Opt level: O2

void __thiscall
RandomizedAttackerStrategy::generateActions
          (RandomizedAttackerStrategy *this,PlayerSight *sight,Actions *actions)

{
  float fVar1;
  float fVar2;
  int local_3c;
  vector<int,_std::allocator<int>_> targets;
  
  if ((this->field_0xc == '\0') && (sight->canSuckAttack == true)) {
    targets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    targets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    targets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    for (local_3c = 0; local_3c < sight->unitInSightCount; local_3c = local_3c + 1) {
      fVar1 = *(float *)(*(long *)&sight->unitInSight + 4 + (long)local_3c * 0x14) - (sight->pos).x;
      fVar2 = *(float *)(*(long *)&sight->unitInSight + 8 + (long)local_3c * 0x14) - (sight->pos).y;
      if (SQRT(fVar1 * fVar1 + fVar2 * fVar2) <= 4.0) {
        std::vector<int,_std::allocator<int>_>::push_back(&targets,&local_3c);
      }
    }
    std::random_shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               targets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               targets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_finish);
    if (targets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        targets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      Actions::emplace(actions,SuckAttack,
                       *(int *)(*(long *)&sight->unitInSight +
                               (long)*targets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start * 0x14),(Vec2)0x0);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&targets.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void RandomizedAttackerStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    if (!sight.canSuckAttack)
        return;
    vector<int> targets;
    for (int i = 0; i < sight.unitInSightCount; ++i)
        if ((sight.unitInSight[i].pos - sight.pos).length() <= SuckRange)
            targets.push_back(i);
    random_shuffle(targets.begin(), targets.end());
	if (targets.size() > 0)
		actions->emplace(SuckAttack, sight.unitInSight[targets[0]].id, Vec2());
}